

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> * __thiscall
Parser::statements(vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>
                   *__return_storage_ptr__,Parser *this)

{
  _Alloc_hider _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  initializer_list<TokenType> __l;
  allocator_type local_51;
  _Alloc_hider local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    local_38 = 0x4200000007;
    __l._M_len = 2;
    __l._M_array = (iterator)&stack0xffffffffffffffc8;
    std::vector<TokenType,_std::allocator<TokenType>_>::vector
              ((vector<TokenType,_std::allocator<TokenType>_> *)&stack0xffffffffffffffb0,__l,
               &local_51);
    p_Var2 = local_48;
    _Var1._M_p = local_50._M_p;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p == local_48) {
      bVar3 = false;
    }
    else {
      do {
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_p)->
                         _vptr__Sp_counted_base + 4);
        bVar3 = match(this,*(TokenType *)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_p)->
                             _vptr__Sp_counted_base);
        _Var1._M_p = (pointer)p_Var4;
      } while (p_Var4 != p_Var2 && !bVar3);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(local_50._M_p,local_40 - (long)local_50._M_p);
    }
    if (bVar3 != false) break;
    statement((Parser *)&stack0xffffffffffffffb0);
    std::vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>::
    emplace_back<std::shared_ptr<Statement>>
              ((vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>> *)
               __return_storage_ptr__,(shared_ptr<Statement> *)&stack0xffffffffffffffb0);
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ptr<Statement>> Parser::statements() {
    std::vector<ptr<Statement>> statList;
    while(!matchAny({ TokenType::RightCurly, TokenType::EndOfFile }))
        statList.push_back(statement());
    return statList;
}